

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face-table.c
# Opt level: O0

ndn_table_id_t ndn_facetab_register(ndn_face_table_t *self,ndn_face_intf_t *face)

{
  ushort local_22;
  ndn_table_id_t i;
  ndn_face_intf_t *face_local;
  ndn_face_table_t *self_local;
  
  local_22 = 0;
  while( true ) {
    if (self->capacity <= local_22) {
      return 0xffff;
    }
    if (self[(ulong)local_22 + 1] == (ndn_face_table_t)0x0) break;
    local_22 = local_22 + 1;
  }
  self[(ulong)local_22 + 1] = (ndn_face_table_t)face;
  return local_22;
}

Assistant:

ndn_table_id_t ndn_facetab_register(ndn_face_table_t* self, ndn_face_intf_t* face){
  ndn_table_id_t i;
  for(i = 0; i < self->capacity; i ++){
    if(self->slots[i] == NULL){
      self->slots[i] = face;
      return i;
    }
  }
  return NDN_INVALID_ID;
}